

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

bool QtPrivate::QLessThanOperatorForType<QDBusObjectPath,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  bool bVar1;
  
  bVar1 = operator<((QDBusObjectPath *)a,(QDBusObjectPath *)b);
  return bVar1;
}

Assistant:

static bool lessThan(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) < *reinterpret_cast<const T *>(b); }